

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLNode::SetValue(XMLNode *this,char *str,bool staticMem)

{
  byte in_DL;
  StrPair *in_RSI;
  StrPair *in_RDI;
  char *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  
  if ((in_DL & 1) == 0) {
    StrPair::SetStr(in_RSI,(char *)(CONCAT17(in_DL,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff),
                    (int)((ulong)in_RDI >> 0x20));
  }
  else {
    StrPair::SetInternedStr(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void XMLNode::SetValue( const char* str, bool staticMem )
{
    if ( staticMem ) {
        _value.SetInternedStr( str );
    }
    else {
        _value.SetStr( str );
    }
}